

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::OP_SetNativeIntElementI
               (Var instance,Var aElementIndex,int32 iValue,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar6;
  undefined4 *puVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  JavascriptArray *this;
  uint32 indexInt;
  ulong uVar8;
  uint uVar5;
  
  lVar1 = *instance;
  uVar8 = (ulong)aElementIndex & 0xffff000000000000;
  uVar5 = (uint)CONCAT71((int7)((ulong)lVar1 >> 8),uVar8 != 0x1000000000000);
  if (((ulong)aElementIndex & 0x1ffff00000000) != 0x1000000000000 && uVar8 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    uVar5 = (uint)CONCAT71(extraout_var,bVar3);
    if (!bVar3) goto LAB_00abdf4a;
    *puVar7 = 0;
  }
  if (uVar8 == 0x1000000000000) {
    if (((ulong)aElementIndex & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      uVar5 = (uint)CONCAT71(extraout_var_00,bVar3);
      if (!bVar3) {
LAB_00abdf4a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    bVar3 = true;
    indexInt = (uint32)aElementIndex;
    if (-1 < (int)indexInt) {
      bVar4 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                        (&scriptContext->optimizationOverrides);
      uVar5 = (uint)CONCAT71(extraout_var_01,bVar4);
      if (bVar4) {
        this = (JavascriptArray *)VarTo<Js::JavascriptNativeIntArray>(instance);
        BVar6 = JavascriptArray::TryGrowHeadSegmentAndSetItem<int,Js::JavascriptNativeIntArray>
                          (this,indexInt,iValue);
        if (BVar6 == 0) {
          JavascriptNativeIntArray::SetItem((JavascriptNativeIntArray *)this,indexInt,iValue);
        }
        uVar5 = (uint)(lVar1 != *instance);
        bVar3 = false;
      }
    }
    if (!bVar3) {
      return uVar5;
    }
  }
  OP_SetElementI(instance,aElementIndex,(Var)((ulong)(uint)iValue | 0x1000000000000),scriptContext,
                 flags);
  return (uint)(lVar1 != *instance);
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeIntElementI(
        Var instance,
        Var aElementIndex,
        int32 iValue,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeIntElementI);

        INT_PTR vt = (INT_PTR)nullptr;
        vt = VirtualTableInfoBase::GetVirtualTable(instance);

        if (TaggedInt::Is(aElementIndex))
        {
            int32 indexInt = TaggedInt::ToInt32(aElementIndex);
            if (indexInt >= 0 && scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                JavascriptNativeIntArray *arr = VarTo<JavascriptNativeIntArray>(instance);
                if (!(arr->TryGrowHeadSegmentAndSetItem<int32, JavascriptNativeIntArray>((uint32)indexInt, iValue)))
                {
                    arr->SetItem(indexInt, iValue);
                }
                return vt != VirtualTableInfoBase::GetVirtualTable(instance);
            }
        }

        JavascriptOperators::OP_SetElementI(instance, aElementIndex, JavascriptNumber::ToVar(iValue, scriptContext), scriptContext, flags);
        return vt != VirtualTableInfoBase::GetVirtualTable(instance);
        JIT_HELPER_END(Op_SetNativeIntElementI);
    }